

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_ciphersuite(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint8_t *puVar7;
  size_t sVar8;
  uint8_t iv_3 [16];
  char enc1 [256];
  char enc2 [256];
  char dec2 [256];
  char dec1 [256];
  size_t local_450;
  undefined1 local_448 [8];
  uint8_t auStack_440 [8];
  byte local_438 [248];
  byte abStack_340 [8];
  undefined1 local_338 [248];
  uint8_t auStack_240 [8];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  ppVar2 = new_aead(cs1->aead,cs1->hash,1,"012345678901234567890123456789012345678901234567",
                    (ptls_iovec_t)ZEXT816(0),(char *)0x0);
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x8b,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
  }
  sVar6 = ppVar2->algo->iv_size;
  puVar7 = ppVar2->static_iv;
  if (sVar6 - 8 != 0) {
    memcpy(local_438,puVar7,sVar6 - 8);
  }
  lVar3 = -0x40;
  do {
    auStack_440[sVar6] = ppVar2->static_iv[sVar6 - 8];
    sVar6 = sVar6 + 1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0);
  (*ppVar2->do_encrypt_init)(ppVar2,local_438,(void *)0x0,0);
  sVar4 = (*ppVar2->do_encrypt_update)(ppVar2,local_438,"hello world",0xb);
  local_450 = (*ppVar2->do_encrypt_final)(ppVar2,local_438 + sVar4);
  sVar6 = ppVar2->algo->iv_size;
  if (sVar6 - 8 != 0) {
    memcpy(local_338,puVar7,sVar6 - 8);
  }
  lVar3 = 0x38;
  do {
    abStack_340[sVar6] = (byte)(1L >> ((byte)lVar3 & 0x3f)) ^ ppVar2->static_iv[sVar6 - 8];
    lVar3 = lVar3 + -8;
    sVar6 = sVar6 + 1;
  } while (lVar3 != -8);
  (*ppVar2->do_encrypt_init)(ppVar2,local_338,(void *)0x0,0);
  sVar6 = (*ppVar2->do_encrypt_update)(ppVar2,local_338,"good bye, all",0xd);
  sVar5 = (*ppVar2->do_encrypt_final)(ppVar2,local_338 + sVar6);
  (*ppVar2->dispose_crypto)(ppVar2);
  (*ptls_clear_memory)(puVar7,ppVar2->algo->iv_size);
  free(ppVar2);
  ppVar2 = new_aead(cs2->aead,cs2->hash,0,"012345678901234567890123456789012345678901234567",
                    (ptls_iovec_t)ZEXT816(0),(char *)0x0);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    sVar8 = ppVar2->algo->iv_size;
    puVar7 = ppVar2->static_iv;
    if (sVar8 - 8 != 0) {
      memcpy(local_238,puVar7,sVar8 - 8);
    }
    local_450 = local_450 + sVar4;
    lVar3 = -0x40;
    do {
      auStack_240[sVar8] = ppVar2->static_iv[sVar8 - 8];
      sVar8 = sVar8 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0);
    sVar8 = (*ppVar2->do_decrypt)(ppVar2,local_138,local_438,local_450,local_238,(void *)0x0,0);
    _ok((uint)(sVar8 != 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x99);
    sVar4 = ppVar2->algo->iv_size;
    if (sVar4 - 8 != 0) {
      memcpy(local_448,puVar7,sVar4 - 8);
    }
    lVar3 = 0x38;
    do {
      local_448[sVar4 - 8] = (byte)(1L >> ((byte)lVar3 & 0x3f)) ^ ppVar2->static_iv[sVar4 - 8];
      lVar3 = lVar3 + -8;
      sVar4 = sVar4 + 1;
    } while (lVar3 != -8);
    sVar6 = (*ppVar2->do_decrypt)(ppVar2,local_238,local_338,sVar5 + sVar6,local_448,(void *)0x0,0);
    _ok((uint)(sVar6 != 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9b);
    _ok((uint)(sVar8 == 0xb),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9c);
    iVar1 = bcmp("hello world",local_138,sVar8);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9d);
    _ok((uint)(sVar6 == 0xd),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9e);
    iVar1 = bcmp("good bye, all",local_238,sVar6 - 1);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9f);
    local_438[0] = local_438[0] ^ 1;
    sVar6 = ppVar2->algo->iv_size;
    if (sVar6 - 8 != 0) {
      memcpy(local_448,puVar7,sVar6 - 8);
    }
    lVar3 = -0x40;
    do {
      local_448[sVar6 - 8] = ppVar2->static_iv[sVar6 - 8];
      sVar6 = sVar6 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0);
    sVar6 = (*ppVar2->do_decrypt)(ppVar2,local_138,local_438,local_450,local_448,(void *)0x0,0);
    _ok((uint)(sVar6 == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xa4);
    (*ppVar2->dispose_crypto)(ppVar2);
    (*ptls_clear_memory)(puVar7,ppVar2->algo->iv_size);
    free(ppVar2);
    return;
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0x95,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_ciphersuite(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567", *src1 = "hello world", *src2 = "good bye, all";
    ptls_aead_context_t *c;
    char enc1[256], enc2[256], dec1[256], dec2[256];
    size_t enc1len, enc2len, dec1len, dec2len;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    ptls_aead_encrypt_init(c, 0, NULL, 0);
    enc1len = ptls_aead_encrypt_update(c, enc1, src1, strlen(src1));
    enc1len += ptls_aead_encrypt_final(c, enc1 + enc1len);
    ptls_aead_encrypt_init(c, 1, NULL, 0);
    enc2len = ptls_aead_encrypt_update(c, enc2, src2, strlen(src2));
    enc2len += ptls_aead_encrypt_final(c, enc2 + enc2len);
    ptls_aead_free(c);

    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    assert(c != NULL);

    /* decrypt and compare */
    dec1len = ptls_aead_decrypt(c, dec1, enc1, enc1len, 0, NULL, 0);
    ok(dec1len != SIZE_MAX);
    dec2len = ptls_aead_decrypt(c, dec2, enc2, enc2len, 1, NULL, 0);
    ok(dec2len != SIZE_MAX);
    ok(strlen(src1) == dec1len);
    ok(memcmp(src1, dec1, dec1len) == 0);
    ok(strlen(src2) == dec2len);
    ok(memcmp(src2, dec2, dec2len - 1) == 0);

    /* alter and decrypt to detect failure */
    enc1[0] ^= 1;
    dec1len = ptls_aead_decrypt(c, dec1, enc1, enc1len, 0, NULL, 0);
    ok(dec1len == SIZE_MAX);

    ptls_aead_free(c);
}